

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

char * __thiscall QTableModel::index(QTableModel *this,char *__s,int __c)

{
  int iVar1;
  uint uVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  undefined4 in_register_00000014;
  QTableWidgetItem *pQVar5;
  long in_FS_OFFSET;
  int col;
  int row;
  int id;
  int i;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_6c;
  undefined1 local_40 [24];
  undefined1 local_28 [24];
  QTableWidgetItem *local_10;
  long local_8;
  
  pQVar5 = (QTableWidgetItem *)CONCAT44(in_register_00000014,__c);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (pQVar5 == (QTableWidgetItem *)0x0) {
    QModelIndex::QModelIndex((QModelIndex *)0x8d54ac);
  }
  else {
    local_6c = pQVar5->d->id;
    if (((local_6c < 0) ||
        (qVar3 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(__s + 0x18)),
        qVar3 <= local_6c)) ||
       (ppQVar4 = QList<QTableWidgetItem_*>::at
                            ((QList<QTableWidgetItem_*> *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
       *ppQVar4 != pQVar5)) {
      local_10 = pQVar5;
      qVar3 = QListSpecialMethodsBase<QTableWidgetItem*>::indexOf<QTableWidgetItem*>
                        ((QListSpecialMethodsBase<QTableWidgetItem_*> *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (QTableWidgetItem **)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0x8d5543);
      local_6c = (int)qVar3;
      if (local_6c == -1) {
        QModelIndex::QModelIndex((QModelIndex *)0x8d5558);
        goto LAB_008d55fd;
      }
    }
    QModelIndex::QModelIndex((QModelIndex *)0x8d5573);
    iVar1 = (**(code **)(*(long *)__s + 0x80))(__s,local_28);
    uVar2 = local_6c / iVar1;
    QModelIndex::QModelIndex((QModelIndex *)0x8d55a7);
    (**(code **)(*(long *)__s + 0x80))(__s,local_40);
    QModelIndex::QModelIndex((QModelIndex *)0x8d55e1);
    QAbstractTableModel::index((int)this,(int)__s,(QModelIndex *)(ulong)uVar2);
  }
LAB_008d55fd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (char *)this;
}

Assistant:

QModelIndex QTableModel::index(const QTableWidgetItem *item) const
{
    if (!item)
        return QModelIndex();
    int i = -1;
    const int id = item->d->id;
    if (id >= 0 && id < tableItems.size() && tableItems.at(id) == item) {
        i = id;
    } else { // we need to search for the item
        i = tableItems.indexOf(const_cast<QTableWidgetItem*>(item));
        if (i == -1) // not found
            return QModelIndex();
    }
    int row = i / columnCount();
    int col = i % columnCount();
    return QAbstractTableModel::index(row, col);
}